

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O0

Result * validateOptimizer(Result *__return_storage_ptr__,Optimizer *optimizer)

{
  Result *pRVar1;
  bool bVar2;
  OptimizerTypeCase OVar3;
  DoubleParameter *pDVar4;
  Int64Parameter *pIVar5;
  allocator local_2b1;
  string local_2b0;
  Result local_290;
  allocator local_261;
  string local_260;
  Result local_240;
  allocator local_211;
  string local_210;
  Result local_1f0;
  allocator local_1c1;
  string local_1c0;
  Result local_1a0;
  allocator local_171;
  string local_170;
  Result local_150;
  AdamOptimizer *local_128;
  AdamOptimizer *adamOptimizer;
  string local_118;
  Result local_f8;
  allocator local_c9;
  string local_c8;
  Result local_a8;
  undefined4 local_7c;
  SGDOptimizer *local_78;
  SGDOptimizer *sgdOptimizer;
  undefined1 local_60 [8];
  string err;
  Result r;
  Optimizer *optimizer_local;
  
  CoreML::Result::Result((Result *)((long)&err.field_2 + 8));
  std::__cxx11::string::string((string *)local_60);
  OVar3 = CoreML::Specification::Optimizer::OptimizerType_case(optimizer);
  if (OVar3 == kSgdOptimizer) {
    local_78 = CoreML::Specification::Optimizer::sgdoptimizer(optimizer);
    bVar2 = CoreML::Specification::SGDOptimizer::has_learningrate(local_78);
    if (!bVar2) {
      std::__cxx11::string::operator=
                ((string *)local_60,"SGD optimizer should include learningRate parameter.");
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_60);
      goto LAB_009affe7;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"learningRate",&local_c9);
    pDVar4 = CoreML::Specification::SGDOptimizer::learningrate(local_78);
    CoreML::validateDoubleParameter(&local_a8,&local_c8,pDVar4);
    pRVar1 = (Result *)((long)&err.field_2 + 8);
    CoreML::Result::operator=(pRVar1,&local_a8);
    CoreML::Result::~Result(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    bVar2 = CoreML::Result::good(pRVar1);
    if (!bVar2) {
      CoreML::Result::Result(__return_storage_ptr__,(Result *)((long)&err.field_2 + 8));
      goto LAB_009affe7;
    }
    bVar2 = CoreML::Specification::SGDOptimizer::has_minibatchsize(local_78);
    if (!bVar2) {
      std::__cxx11::string::operator=
                ((string *)local_60,"SGD optimizer should include miniBatchSize parameter.");
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_60);
      goto LAB_009affe7;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_118,"miniBatchSize",(allocator *)((long)&adamOptimizer + 7));
    pIVar5 = CoreML::Specification::SGDOptimizer::minibatchsize(local_78);
    CoreML::validateInt64Parameter(&local_f8,&local_118,pIVar5,true);
    pRVar1 = (Result *)((long)&err.field_2 + 8);
    CoreML::Result::operator=(pRVar1,&local_f8);
    CoreML::Result::~Result(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)((long)&adamOptimizer + 7));
    bVar2 = CoreML::Result::good(pRVar1);
    if (!bVar2) {
      CoreML::Result::Result(__return_storage_ptr__,(Result *)((long)&err.field_2 + 8));
      goto LAB_009affe7;
    }
  }
  else {
    if (OVar3 != kAdamOptimizer) {
      std::__cxx11::string::operator=((string *)local_60,"Optimizer is not recognized.");
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_60);
      goto LAB_009affe7;
    }
    local_128 = CoreML::Specification::Optimizer::adamoptimizer(optimizer);
    bVar2 = CoreML::Specification::AdamOptimizer::has_learningrate(local_128);
    if (!bVar2) {
      std::__cxx11::string::operator=
                ((string *)local_60,"ADAM optimizer should include learningRate parameter.");
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_60);
      goto LAB_009affe7;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_170,"learningRate",&local_171);
    pDVar4 = CoreML::Specification::AdamOptimizer::learningrate(local_128);
    CoreML::validateDoubleParameter(&local_150,&local_170,pDVar4);
    pRVar1 = (Result *)((long)&err.field_2 + 8);
    CoreML::Result::operator=(pRVar1,&local_150);
    CoreML::Result::~Result(&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
    bVar2 = CoreML::Result::good(pRVar1);
    if (!bVar2) {
      CoreML::Result::Result(__return_storage_ptr__,(Result *)((long)&err.field_2 + 8));
      goto LAB_009affe7;
    }
    bVar2 = CoreML::Specification::AdamOptimizer::has_minibatchsize(local_128);
    if (!bVar2) {
      std::__cxx11::string::operator=
                ((string *)local_60,"ADAM optimizer should include miniBatchSize parameter.");
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_60);
      goto LAB_009affe7;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1c0,"miniBatchSize",&local_1c1);
    pIVar5 = CoreML::Specification::AdamOptimizer::minibatchsize(local_128);
    CoreML::validateInt64Parameter(&local_1a0,&local_1c0,pIVar5,true);
    pRVar1 = (Result *)((long)&err.field_2 + 8);
    CoreML::Result::operator=(pRVar1,&local_1a0);
    CoreML::Result::~Result(&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    bVar2 = CoreML::Result::good(pRVar1);
    if (!bVar2) {
      CoreML::Result::Result(__return_storage_ptr__,(Result *)((long)&err.field_2 + 8));
      goto LAB_009affe7;
    }
    bVar2 = CoreML::Specification::AdamOptimizer::has_beta1(local_128);
    if (!bVar2) {
      std::__cxx11::string::operator=
                ((string *)local_60,"ADAM optimizer should include beta1 parameter.");
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_60);
      goto LAB_009affe7;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_210,"beta1",&local_211);
    pDVar4 = CoreML::Specification::AdamOptimizer::beta1(local_128);
    CoreML::validateDoubleParameter(&local_1f0,&local_210,pDVar4);
    pRVar1 = (Result *)((long)&err.field_2 + 8);
    CoreML::Result::operator=(pRVar1,&local_1f0);
    CoreML::Result::~Result(&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    bVar2 = CoreML::Result::good(pRVar1);
    if (!bVar2) {
      CoreML::Result::Result(__return_storage_ptr__,(Result *)((long)&err.field_2 + 8));
      goto LAB_009affe7;
    }
    bVar2 = CoreML::Specification::AdamOptimizer::has_beta2(local_128);
    if (!bVar2) {
      std::__cxx11::string::operator=
                ((string *)local_60,"ADAM optimizer should include beta2 parameter.");
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_60);
      goto LAB_009affe7;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_260,"beta2",&local_261);
    pDVar4 = CoreML::Specification::AdamOptimizer::beta2(local_128);
    CoreML::validateDoubleParameter(&local_240,&local_260,pDVar4);
    pRVar1 = (Result *)((long)&err.field_2 + 8);
    CoreML::Result::operator=(pRVar1,&local_240);
    CoreML::Result::~Result(&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    bVar2 = CoreML::Result::good(pRVar1);
    if (!bVar2) {
      CoreML::Result::Result(__return_storage_ptr__,(Result *)((long)&err.field_2 + 8));
      goto LAB_009affe7;
    }
    bVar2 = CoreML::Specification::AdamOptimizer::has_eps(local_128);
    if (!bVar2) {
      std::__cxx11::string::operator=
                ((string *)local_60,"ADAM optimizer should include eps (epslion) parameter.");
      CoreML::Result::Result
                (__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_60);
      goto LAB_009affe7;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2b0,"eps",&local_2b1);
    pDVar4 = CoreML::Specification::AdamOptimizer::eps(local_128);
    CoreML::validateDoubleParameter(&local_290,&local_2b0,pDVar4);
    pRVar1 = (Result *)((long)&err.field_2 + 8);
    CoreML::Result::operator=(pRVar1,&local_290);
    CoreML::Result::~Result(&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    bVar2 = CoreML::Result::good(pRVar1);
    if (!bVar2) {
      CoreML::Result::Result(__return_storage_ptr__,(Result *)((long)&err.field_2 + 8));
      goto LAB_009affe7;
    }
  }
  CoreML::Result::Result(__return_storage_ptr__,(Result *)((long)&err.field_2 + 8));
LAB_009affe7:
  local_7c = 1;
  std::__cxx11::string::~string((string *)local_60);
  CoreML::Result::~Result((Result *)((long)&err.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

static Result validateOptimizer(const Specification::Optimizer& optimizer) {
    Result r;
    std::string err;
    
    switch (optimizer.OptimizerType_case()) {
        case Specification::Optimizer::kSgdOptimizer:
        {
            const Specification::SGDOptimizer &sgdOptimizer = optimizer.sgdoptimizer();
            
            if (false == sgdOptimizer.has_learningrate()) {
                err = "SGD optimizer should include learningRate parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateDoubleParameter("learningRate", sgdOptimizer.learningrate());
            if (!r.good()) {return r;}
            
            if (false == sgdOptimizer.has_minibatchsize()) {
                err = "SGD optimizer should include miniBatchSize parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateInt64Parameter("miniBatchSize", sgdOptimizer.minibatchsize(), true);
            if (!r.good()) {return r;}
            
            break;
        }
        case Specification::Optimizer::kAdamOptimizer:
        {
            const Specification::AdamOptimizer &adamOptimizer = optimizer.adamoptimizer();
            
            if (false == adamOptimizer.has_learningrate()) {
                err = "ADAM optimizer should include learningRate parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateDoubleParameter("learningRate", adamOptimizer.learningrate());
            if (!r.good()) {return r;}
            
            if (false == adamOptimizer.has_minibatchsize()) {
                err = "ADAM optimizer should include miniBatchSize parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateInt64Parameter("miniBatchSize", adamOptimizer.minibatchsize(), true);
            if (!r.good()) {return r;}
            
            if (false == adamOptimizer.has_beta1()) {
                err = "ADAM optimizer should include beta1 parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateDoubleParameter("beta1", adamOptimizer.beta1());
            if (!r.good()) {return r;}
            
            if (false == adamOptimizer.has_beta2()) {
                err = "ADAM optimizer should include beta2 parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateDoubleParameter("beta2", adamOptimizer.beta2());
            if (!r.good()) {return r;}
            
            if (false == adamOptimizer.has_eps()) {
                err = "ADAM optimizer should include eps (epslion) parameter.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
            
            r = validateDoubleParameter("eps", adamOptimizer.eps());
            if (!r.good()) {return r;}
    
            break;
        }
        default:
            err = "Optimizer is not recognized.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }
    
    return r;
}